

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

bool __thiscall
ADSBHubConnection::StreamProcessDataSBSLine(ADSBHubConnection *this,char *pStart,char *pEnd)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  long lVar5;
  logLevelTy lvl;
  char *szMsg;
  double dVar6;
  char *pStart_local;
  string local_218;
  string token;
  tm tm;
  string local_198;
  FDKeyTy key;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pStart_local = pStart;
  readToken_abi_cxx11_(&token,&pStart_local,pEnd,',');
  bVar1 = std::operator!=(&token,"MSG");
  if (bVar1) {
    if ((int)dataRefs.iLogLevel < 1) {
      bVar1 = false;
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x135,"StreamProcessDataSBSLine",logDEBUG,"Ignoring line of type \'%s\'",
             token._M_dataplus._M_p);
      goto LAB_0013ffa6;
    }
LAB_0013f8c6:
    bVar1 = false;
  }
  else {
    readToken_abi_cxx11_(&local_48,&pStart_local,pEnd,',');
    std::__cxx11::string::~string((string *)&local_48);
    readToken_abi_cxx11_(&local_68,&pStart_local,pEnd,',');
    std::__cxx11::string::~string((string *)&local_68);
    readToken_abi_cxx11_(&local_88,&pStart_local,pEnd,',');
    std::__cxx11::string::~string((string *)&local_88);
    if (pEnd < pStart_local) {
      if (3 < (int)dataRefs.iLogLevel) goto LAB_0013f8c6;
      szMsg = "Line too short, not even read an ADS-B hex id yet";
      lvl = logERR;
      iVar3 = 0x13d;
    }
    else {
      readToken_abi_cxx11_((string *)&tm,&pStart_local,pEnd,',');
      std::__cxx11::string::operator=((string *)&token,(string *)&tm);
      std::__cxx11::string::~string((string *)&tm);
      if (pEnd < pStart_local) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0013f8c6;
        szMsg = "Line too short, just only read an ADS-B hex id";
        lvl = logERR;
        iVar3 = 0x141;
      }
      else {
        if (token._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_198,(string *)&token);
          LTFlightData::FDKeyTy::FDKeyTy(&key,KEY_ICAO,&local_198,0x10);
          std::__cxx11::string::~string((string *)&local_198);
          if (((this->fdKey).eKeyType != key.eKeyType) || ((this->fdKey).num != key.num)) {
            ProcessPlaneData(this);
            LTFlightData::FDKeyTy::operator=(&this->fdKey,&key);
          }
          readToken_abi_cxx11_(&local_a8,&pStart_local,pEnd,',');
          std::__cxx11::string::~string((string *)&local_a8);
          readToken_abi_cxx11_(&local_c8,&pStart_local,pEnd,',');
          std::__cxx11::string::~string((string *)&local_c8);
          readToken_abi_cxx11_(&local_e8,&pStart_local,pEnd,',');
          std::__cxx11::string::~string((string *)&local_e8);
          if (pEnd < pStart_local) {
            if ((int)dataRefs.iLogLevel < 4) {
              bVar1 = false;
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                     ,0x153,"StreamProcessDataSBSLine",logERR,
                     "Line too short, not yet read date/time of message created");
            }
            else {
              bVar1 = false;
            }
          }
          else {
            tm.tm_gmtoff = 0;
            tm.tm_mon = 0;
            tm.tm_year = 0;
            tm.tm_wday = 0;
            tm.tm_yday = 0;
            tm.tm_zone = (char *)0x0;
            tm.tm_sec = 0;
            tm.tm_min = 0;
            tm.tm_hour = 0;
            tm.tm_mday = 0;
            tm.tm_isdst = -1;
            tm._36_4_ = 0;
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,'/');
            iVar3 = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            tm.tm_year = iVar3 + -0x76c;
            std::__cxx11::string::~string((string *)&local_218);
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,'/');
            iVar3 = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            tm.tm_mon = iVar3 + -1;
            std::__cxx11::string::~string((string *)&local_218);
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
            iVar3 = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            tm.tm_mday = iVar3;
            std::__cxx11::string::~string((string *)&local_218);
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,':');
            tm.tm_hour = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&local_218);
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,':');
            iVar3 = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            tm.tm_min = iVar3;
            std::__cxx11::string::~string((string *)&local_218);
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,'.');
            tm.tm_sec = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&local_218);
            readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
            iVar3 = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&local_218);
            bVar1 = pStart_local <= pEnd;
            if (pEnd < pStart_local) {
              if ((int)dataRefs.iLogLevel < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                       ,0x160,"StreamProcessDataSBSLine",logERR,
                       "Line too short, not yet read actual data");
              }
            }
            else {
              tVar4 = mktime_utc(&tm);
              dVar6 = (double)iVar3 / 1000.0 + (double)tVar4;
              (this->dyn).ts = dVar6;
              (this->pos)._ts = dVar6;
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                std::__cxx11::string::_M_assign((string *)&(this->stat).call);
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                dVar6 = std::__cxx11::stod(&token,(size_t *)0x0);
                (this->pos)._alt = dVar6 * 0.3048;
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                dVar6 = std::__cxx11::stod(&token,(size_t *)0x0);
                (this->dyn).spd = dVar6;
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                dVar6 = std::__cxx11::stod(&token,(size_t *)0x0);
                (this->dyn).heading = dVar6;
                (this->pos)._head = dVar6;
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                dVar6 = std::__cxx11::stod(&token,(size_t *)0x0);
                (this->pos)._lat = dVar6;
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                dVar6 = std::__cxx11::stod(&token,(size_t *)0x0);
                (this->pos)._lon = dVar6;
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                dVar6 = std::__cxx11::stod(&token,(size_t *)0x0);
                (this->dyn).vsi = dVar6;
              }
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                lVar5 = std::__cxx11::stol(&token,(size_t *)0x0,10);
                (this->dyn).radar.code = lVar5;
              }
              readToken_abi_cxx11_(&local_108,&pStart_local,pEnd,',');
              std::__cxx11::string::~string((string *)&local_108);
              readToken_abi_cxx11_(&local_128,&pStart_local,pEnd,',');
              std::__cxx11::string::~string((string *)&local_128);
              readToken_abi_cxx11_(&local_148,&pStart_local,pEnd,',');
              std::__cxx11::string::~string((string *)&local_148);
              readToken_abi_cxx11_(&local_218,&pStart_local,pEnd,',');
              lVar5 = std::__cxx11::string::operator=((string *)&token,(string *)&local_218);
              lVar5 = *(long *)(lVar5 + 8);
              std::__cxx11::string::~string((string *)&local_218);
              if (lVar5 != 0) {
                bVar2 = std::operator==(&token,"1");
                (this->dyn).gnd = bVar2;
                (this->pos).f =
                     (posFlagsTy)
                     (((ushort)*(undefined4 *)&(this->pos).f & 0xfcff | (ushort)bVar2 << 8) + 0x100)
                ;
              }
            }
          }
          std::__cxx11::string::~string((string *)&key.key);
          goto LAB_0013ffa6;
        }
        lvl = logDEBUG;
        bVar1 = false;
        if (0 < (int)dataRefs.iLogLevel) goto LAB_0013ffa6;
        szMsg = "ADS-B hex id was empty";
        iVar3 = 0x143;
      }
    }
    bVar1 = false;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
           ,iVar3,"StreamProcessDataSBSLine",lvl,szMsg);
  }
LAB_0013ffa6:
  std::__cxx11::string::~string((string *)&token);
  return bVar1;
}

Assistant:

bool ADSBHubConnection::StreamProcessDataSBSLine (const char* pStart, const char* pEnd)
{
    // Line must start with 'MSG', otherwise we ignore
    std::string token = readToken(pStart, pEnd);
    if (token != "MSG") {
        LOG_MSG(logDEBUG, "Ignoring line of type '%s'", token.c_str());
        return false;
    }
    
    // Ignore 3 fields (transmission type, session ID, aircraft id)
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    TEST_END("not even read an ADS-B hex id yet");
    
    // Read the ADS-B hex id
    token = readToken(pStart, pEnd);
    TEST_END("just only read an ADS-B hex id");
    if (token.empty()) {
        LOG_MSG(logDEBUG, "ADS-B hex id was empty");
        return false;
    }
    LTFlightData::FDKeyTy key (LTFlightData::KEY_ICAO, token);
    
    // Change of plane? Then process previous data first before continuing
    if (fdKey != key) {
        ProcessPlaneData();
        // New plane
        fdKey = key;
    }
    
    // Skip over FlightID and date/time message created
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    TEST_END("not yet read date/time of message created");
    
    // Date/time message logged
    std::tm tm;
    memset(&tm, 0, sizeof(tm));
    tm.tm_isdst = -1;               // re-lookup DST info
    tm.tm_year = std::stoi(readToken(pStart, pEnd, '/')) - 1900;
    tm.tm_mon  = std::stoi(readToken(pStart, pEnd, '/')) - 1;
    tm.tm_mday = std::stoi(readToken(pStart, pEnd));
    tm.tm_hour = std::stoi(readToken(pStart, pEnd, ':'));
    tm.tm_min  = std::stoi(readToken(pStart, pEnd, ':'));
    tm.tm_sec  = std::stoi(readToken(pStart, pEnd, '.'));
    int ms     = std::stoi(readToken(pStart, pEnd));
    TEST_END("not yet read actual data");
    time_t ts = mktime_utc(tm);
    pos.ts() = dyn.ts = double(ts) + double(ms) / 1000.0;
    
    // Call sign
    if (!(token = readToken(pStart, pEnd)).empty())
        stat.call = token;
    
    // Altitude, supposingly "HAE" = Height above ellipsoid
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.SetAltFt(std::stod(token));

    // Ground Speed
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.spd = std::stod(token);
    
    // Track (it is not heading...but best we have, we don't get heading)
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.heading() = dyn.heading = std::stod(token);
    
    // Latitude, Longitude
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.lat() = std::stod(token);
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.lon() = std::stod(token);

    // VSI
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.vsi = std::stod(token);

    // Squawk
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.radar.code = std::stol(token);

    // Skip over Alert, Emergency, SPI flags
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);

    // Ground flag
    if (!(token = readToken(pStart, pEnd)).empty()) {
        dyn.gnd = token == "1";
        pos.f.onGrnd = dyn.gnd ? GND_ON : GND_OFF;
    }
    
    return true;
}